

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O2

bool operator<(COutPoint *a,COutPoint *b)

{
  weak_ordering wVar1;
  long in_FS_OFFSET;
  uint32_t *local_28;
  COutPoint *local_20;
  uint32_t *local_18;
  COutPoint *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &a->n;
  local_28 = &b->n;
  local_20 = b;
  local_10 = a;
  wVar1 = std::
          __tuple_cmp<std::weak_ordering,std::tuple<transaction_identifier<false>const&,unsigned_int_const&>,std::tuple<transaction_identifier<false>const&,unsigned_int_const&>,0ul,1ul>
                    (&local_18,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)((byte)wVar1._M_value >> 7);
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const COutPoint& a, const COutPoint& b)
    {
        return std::tie(a.hash, a.n) < std::tie(b.hash, b.n);
    }